

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_132a07::preprocessor<baryonyx::problem>::preprocessor
          (preprocessor<baryonyx::problem> *this,context *ctx_,problem *pb_)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  reference pvVar4;
  reference pfVar5;
  function_element *elem_2;
  const_iterator __end0_2;
  const_iterator __begin0_2;
  vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_> *__range3_2;
  int e_2;
  int i_2;
  function_element *elem_1;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_> *__range3_1;
  int e_1;
  int i_1;
  function_element *elem;
  const_iterator __end0;
  const_iterator __begin0;
  vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_> *__range3;
  int e;
  int i;
  allocator<int> local_21;
  problem *local_20;
  problem *pb__local;
  context *ctx__local;
  preprocessor<baryonyx::problem> *this_local;
  
  this->ctx = ctx_;
  this->pb = pb_;
  local_20 = pb_;
  pb__local = (problem *)ctx_;
  ctx__local = (context *)this;
  std::
  unordered_map<int,_bool,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_bool>_>_>
  ::unordered_map(&this->vars);
  sVar2 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::size
                    (&this->pb->equal_constraints);
  std::allocator<int>::allocator(&local_21);
  std::vector<int,_std::allocator<int>_>::vector(&this->equal_constraints,sVar2,&local_21);
  std::allocator<int>::~allocator(&local_21);
  sVar2 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::size
                    (&this->pb->greater_constraints);
  std::allocator<int>::allocator((allocator<int> *)((long)&e + 3));
  std::vector<int,_std::allocator<int>_>::vector
            (&this->greater_constraints,sVar2,(allocator<int> *)((long)&e + 3));
  std::allocator<int>::~allocator((allocator<int> *)((long)&e + 3));
  sVar2 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::size
                    (&this->pb->less_constraints);
  std::allocator<int>::allocator((allocator<int> *)((long)&e + 2));
  std::vector<int,_std::allocator<int>_>::vector
            (&this->less_constraints,sVar2,(allocator<int> *)((long)&e + 2));
  std::allocator<int>::~allocator((allocator<int> *)((long)&e + 2));
  sVar2 = std::vector<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>::size
                    (&(this->pb->vars).values);
  std::allocator<(anonymous_namespace)::pp_variable_access>::allocator
            ((allocator<(anonymous_namespace)::pp_variable_access> *)((long)&e + 1));
  std::
  vector<(anonymous_namespace)::pp_variable_access,_std::allocator<(anonymous_namespace)::pp_variable_access>_>
  ::vector(&this->cache,sVar2,(allocator<(anonymous_namespace)::pp_variable_access> *)((long)&e + 1)
          );
  std::allocator<(anonymous_namespace)::pp_variable_access>::~allocator
            ((allocator<(anonymous_namespace)::pp_variable_access> *)((long)&e + 1));
  to_merge_with_objective_function::to_merge_with_objective_function(&this->merge_obj);
  pp_lifo::pp_lifo(&this->lifo);
  __range3._4_4_ = 0;
  __range3._0_4_ =
       baryonyx::length<std::vector<baryonyx::constraint,std::allocator<baryonyx::constraint>>>
                 (&this->pb->equal_constraints);
  for (; __range3._4_4_ != (int)__range3; __range3._4_4_ = __range3._4_4_ + 1) {
    pvVar3 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::operator[]
                       (&this->pb->equal_constraints,(long)__range3._4_4_);
    __end0 = std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>::
             begin(&pvVar3->elements);
    elem = (function_element *)
           std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>::end
                     (&pvVar3->elements);
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
                        (&__end0,(__normal_iterator<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
                                  *)&elem);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      _e_1 = __gnu_cxx::
             __normal_iterator<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
             ::operator*(&__end0);
      pvVar4 = std::
               vector<(anonymous_namespace)::pp_variable_access,_std::allocator<(anonymous_namespace)::pp_variable_access>_>
               ::operator[](&this->cache,(long)_e_1->variable_index);
      std::vector<int,std::allocator<int>>::emplace_back<int&>
                ((vector<int,std::allocator<int>> *)pvVar4,(int *)((long)&__range3 + 4));
      __gnu_cxx::
      __normal_iterator<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
      ::operator++(&__end0);
    }
  }
  __range3_1._4_4_ = 0;
  __range3_1._0_4_ =
       baryonyx::length<std::vector<baryonyx::constraint,std::allocator<baryonyx::constraint>>>
                 (&this->pb->greater_constraints);
  for (; __range3_1._4_4_ != (int)__range3_1; __range3_1._4_4_ = __range3_1._4_4_ + 1) {
    pvVar3 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::operator[]
                       (&this->pb->greater_constraints,(long)__range3_1._4_4_);
    __end0_1 = std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
               ::begin(&pvVar3->elements);
    elem_1 = (function_element *)
             std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>::
             end(&pvVar3->elements);
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
                        (&__end0_1,
                         (__normal_iterator<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
                          *)&elem_1);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      _e_2 = __gnu_cxx::
             __normal_iterator<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
             ::operator*(&__end0_1);
      pvVar4 = std::
               vector<(anonymous_namespace)::pp_variable_access,_std::allocator<(anonymous_namespace)::pp_variable_access>_>
               ::operator[](&this->cache,(long)_e_2->variable_index);
      std::vector<int,std::allocator<int>>::emplace_back<int&>
                ((vector<int,std::allocator<int>> *)&pvVar4->in_greater_constraints,
                 (int *)((long)&__range3_1 + 4));
      __gnu_cxx::
      __normal_iterator<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
      ::operator++(&__end0_1);
    }
  }
  __range3_2._4_4_ = 0;
  __range3_2._0_4_ =
       baryonyx::length<std::vector<baryonyx::constraint,std::allocator<baryonyx::constraint>>>
                 (&this->pb->less_constraints);
  for (; __range3_2._4_4_ != (int)__range3_2; __range3_2._4_4_ = __range3_2._4_4_ + 1) {
    pvVar3 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::operator[]
                       (&this->pb->less_constraints,(long)__range3_2._4_4_);
    __end0_2 = std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
               ::begin(&pvVar3->elements);
    elem_2 = (function_element *)
             std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>::
             end(&pvVar3->elements);
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
                        (&__end0_2,
                         (__normal_iterator<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
                          *)&elem_2);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      pfVar5 = __gnu_cxx::
               __normal_iterator<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
               ::operator*(&__end0_2);
      pvVar4 = std::
               vector<(anonymous_namespace)::pp_variable_access,_std::allocator<(anonymous_namespace)::pp_variable_access>_>
               ::operator[](&this->cache,(long)pfVar5->variable_index);
      std::vector<int,std::allocator<int>>::emplace_back<int&>
                ((vector<int,std::allocator<int>> *)&pvVar4->in_less_constraints,
                 (int *)((long)&__range3_2 + 4));
      __gnu_cxx::
      __normal_iterator<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
      ::operator++(&__end0_2);
    }
  }
  return;
}

Assistant:

explicit preprocessor(const bx::context& ctx_, const Problem& pb_)
      : ctx(ctx_)
      , pb(pb_)
      , equal_constraints(pb.equal_constraints.size())
      , greater_constraints(pb.greater_constraints.size())
      , less_constraints(pb.less_constraints.size())
      , cache(pb.vars.values.size())
    {
        // The cache stores for each variable, all constraint where element
        // variable is used.

        for (int i = 0, e = bx::length(pb.equal_constraints); i != e; ++i)
            for (const auto& elem : pb.equal_constraints[i].elements)
                cache[elem.variable_index].in_equal_constraints.emplace_back(
                  i);

        for (int i = 0, e = bx::length(pb.greater_constraints); i != e; ++i)
            for (const auto& elem : pb.greater_constraints[i].elements)
                cache[elem.variable_index].in_greater_constraints.emplace_back(
                  i);

        for (int i = 0, e = bx::length(pb.less_constraints); i != e; ++i)
            for (const auto& elem : pb.less_constraints[i].elements)
                cache[elem.variable_index].in_less_constraints.emplace_back(i);
    }